

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

string * __thiscall
kratos::VarExtend::to_string_abi_cxx11_(string *__return_storage_ptr__,VarExtend *this)

{
  uint uVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  ulong local_68 [2];
  long *local_58;
  undefined8 uStack_50;
  long *local_40;
  undefined8 uStack_38;
  long local_30 [2];
  
  uVar1 = (*(this->super_Expr).super_Var.super_IRNode._vptr_IRNode[7])(this);
  (*(this->parent_->super_IRNode)._vptr_IRNode[0x1f])(&local_40);
  local_68[0] = (ulong)uVar1;
  local_58 = local_40;
  uStack_50 = uStack_38;
  format_str.size_ = 0xd2;
  format_str.data_ = (char *)0x9;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_68;
  fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)"{0}\'({1})",format_str,args)
  ;
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VarExtend::to_string() const {
    return ::format("{0}'({1})", width(), parent_->to_string());
}